

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenBinNum(Lexer *this)

{
  int iVar1;
  Lexer *in_RSI;
  
  nextChar(in_RSI);
  iVar1 = in_RSI->currentChar;
  while (iVar1 - 0x30U < 2) {
    nextChar(in_RSI);
    iVar1 = in_RSI->currentChar;
  }
  nextTokenNumType(this,(uint64_t)in_RSI);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenBinNum() noexcept {
  nextChar(); // eat b

  size_t num = 0;
  while (currentChar == '0' || currentChar == '1') {
    num *= 2;
    num += currentChar - '0';
    nextChar(); // eat binary digit
  }

  return nextTokenNumType(num);
}